

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes,uint *pState)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  
  uVar1 = *(ulong *)pObj;
  if ((long)uVar1 < 0) {
    return;
  }
  *(ulong *)pObj = uVar1 | 0x8000000000000000;
  if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar1 < 0) {
    iVar2 = Gia_ObjIsRo(p,pObj);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsPi(p,pObj);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcBmcAnd.c"
                      ,0x9d,
                      "void Bmc_MnaCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, unsigned int *)"
                     );
      }
      uVar3 = 3;
    }
    else if (pState == (uint *)0x0) {
      uVar3 = 1;
    }
    else {
      pObj_00 = Gia_ObjRoToRi(p,pObj);
      uVar3 = Gia_ObjCioId(pObj_00);
      uVar3 = pState[uVar3 >> 4] >> ((char)uVar3 * '\x02' & 0x1fU) & 3;
    }
  }
  else {
    Bmc_MnaCollect_rec(p,pObj + -(uVar1 & 0x1fffffff),vNodes,pState);
    Bmc_MnaCollect_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes,pState);
    uVar1 = *(ulong *)pObj;
    uVar3 = (pObj[-(uVar1 >> 0x20 & 0x1fffffff)].Value == 3 ||
            pObj[-(uVar1 & 0x1fffffff)].Value == 3) | 2;
    if (((uint)(uVar1 >> 0x3d) & 1) + 1 == pObj[-(uVar1 >> 0x20 & 0x1fffffff)].Value) {
      uVar3 = 1;
    }
    if ((((uint)uVar1 >> 0x1d & 1) != 0) + 1 == pObj[-(uVar1 & 0x1fffffff)].Value) {
      uVar3 = 1;
    }
  }
  pObj->Value = uVar3;
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(vNodes,iVar2);
  return;
}

Assistant:

void Bmc_MnaCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes, unsigned * pState )
{
    if ( pObj->fPhase )
        return;
    pObj->fPhase = 1;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Bmc_MnaCollect_rec( p, Gia_ObjFanin0(pObj), vNodes, pState );
        Bmc_MnaCollect_rec( p, Gia_ObjFanin1(pObj), vNodes, pState );
        pObj->Value = Gia_XsimAndCond( Gia_ObjFanin0(pObj)->Value, Gia_ObjFaninC0(pObj), Gia_ObjFanin1(pObj)->Value, Gia_ObjFaninC1(pObj) );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        pObj->Value = pState ? Gia_ManTerSimInfoGet( pState, Gia_ObjCioId(Gia_ObjRoToRi(p, pObj)) ) : GIA_ZER;
    else if ( Gia_ObjIsPi(p, pObj) )
        pObj->Value = GIA_UND;
    else assert( 0 );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}